

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O2

double from_msr_tw_atom_airmont(uint64_t bits,double time_units)

{
  undefined1 auVar1 [16];
  
  if (bits != 0) {
    auVar1._8_4_ = (int)(bits >> 0x20);
    auVar1._0_8_ = bits;
    auVar1._12_4_ = 0x45300000;
    return ((auVar1._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)bits) - 4503599627370496.0)) * 5.0;
  }
  return 1.0;
}

Assistant:

static double from_msr_tw_atom_airmont(uint64_t bits, double time_units) {
  // Used only for Airmont PP0 (CORE) zone
  (void) time_units;
  // If 0 is specified in bits [23:17], defaults to 1 second window.
  const double seconds = bits ? bits * 5.0 : 1.0;
  raplcap_log(DEBUG, "from_msr_tw_atom_airmont: bits=0x%02lX, seconds=%.12f\n", bits, seconds);
  return seconds;
}